

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
* MatchMultiA(optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              *__return_storage_ptr__,CScript *script)

{
  uint uVar1;
  long lVar2;
  CScript *pCVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uchar *puVar7;
  optional<int> oVar8;
  uint uVar9;
  CScript *pCVar10;
  int iVar11;
  long in_FS_OFFSET;
  pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>
  local_c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  opcodetype opcode;
  const_iterator local_60;
  vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_> keyspans;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  keyspans.
  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keyspans.
  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  keyspans.
  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = (script->super_CScriptBase)._size;
  uVar9 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar9 = uVar1;
  }
  if (uVar9 != 0) {
    pCVar10 = script;
    if (0x1c < uVar1) {
      pCVar10 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (((pCVar10->super_CScriptBase)._union.direct[0] == ' ') &&
       (puVar7 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back(&script->super_CScriptBase),
       *puVar7 == 0x9c)) {
      pCVar10 = script;
      if (0x1c < (script->super_CScriptBase)._size) {
        pCVar10 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
      }
      iVar11 = -(int)pCVar10;
      do {
        uVar1 = (script->super_CScriptBase)._size;
        uVar9 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar9 = uVar1;
        }
        iVar6 = *(int *)&(script->super_CScriptBase)._union;
        if (uVar1 < 0x1d) {
          iVar6 = (int)script;
        }
        local_60.ptr = (uchar *)pCVar10;
        if ((int)(uVar9 + iVar11 + iVar6) < 0x22) {
          if (keyspans.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              keyspans.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start &&
              (ulong)((long)keyspans.
                            super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)keyspans.
                           super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x3e71) {
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar5 = CScript::GetOp(script,&local_60,&opcode,&data);
            if (bVar5) {
              uVar1 = (script->super_CScriptBase)._size;
              uVar9 = uVar1 - 0x1d;
              if (uVar1 < 0x1d) {
                uVar9 = uVar1;
              }
              if (uVar1 >= 0x1d) {
                script = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
              }
              pCVar10 = (CScript *)((script->super_CScriptBase)._union.direct + (int)uVar9);
              if ((((CScript *)local_60.ptr == pCVar10) || (*local_60.ptr != 0x9c)) ||
                 (local_60.ptr = local_60.ptr + 1, (CScript *)local_60.ptr != pCVar10))
              goto LAB_001abb99;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,&data);
              oVar8 = GetScriptNumber(opcode,(valtype *)&local_a0,1,
                                      (int)((ulong)((long)keyspans.
                                                  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)keyspans.
                                                  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_a0);
              if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> >> 0x20 & 1) == 0) goto LAB_001abb99;
              local_c0.first =
                   oVar8.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload;
              local_c0.second.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   keyspans.
                   super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_c0.second.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   keyspans.
                   super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_c0.second.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   keyspans.
                   super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              keyspans.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              keyspans.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              keyspans.
              super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              ::
              optional<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true>
                        (__return_storage_ptr__,&local_c0);
              std::
              _Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::
              ~_Vector_base(&local_c0.second.
                             super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                           );
            }
            else {
LAB_001abb99:
              (__return_storage_ptr__->
              super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
              ._M_engaged = false;
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            goto LAB_001abac3;
          }
          break;
        }
        if ((pCVar10->super_CScriptBase)._union.direct[0] != ' ') break;
        local_c0._0_8_ = (long)&(pCVar10->super_CScriptBase)._union + 1;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
        std::vector<Span<unsigned_char_const>,std::allocator<Span<unsigned_char_const>>>::
        emplace_back<unsigned_char_const*,int>
                  ((vector<Span<unsigned_char_const>,std::allocator<Span<unsigned_char_const>>> *)
                   &keyspans,(uchar **)&local_c0,(int *)&data);
        local_60.ptr = (uchar *)((long)&pCVar10[1].super_CScriptBase._union + 1);
        cVar4 = -0x46;
        if ((long)keyspans.
                  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)keyspans.
                  super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x10) {
          cVar4 = -0x54;
        }
        pCVar3 = pCVar10 + 1;
        iVar11 = iVar11 + -0x22;
        pCVar10 = (CScript *)(pCVar10[1].super_CScriptBase._union.direct + 2);
      } while (cVar4 == (pCVar3->super_CScriptBase)._union.direct[1]);
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<int,_std::vector<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>_>_>
  ._M_engaged = false;
LAB_001abac3:
  std::_Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>::
  ~_Vector_base(&keyspans.
                 super__Vector_base<Span<const_unsigned_char>,_std::allocator<Span<const_unsigned_char>_>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<int, std::vector<Span<const unsigned char>>>> MatchMultiA(const CScript& script)
{
    std::vector<Span<const unsigned char>> keyspans;

    // Redundant, but very fast and selective test.
    if (script.size() == 0 || script[0] != 32 || script.back() != OP_NUMEQUAL) return {};

    // Parse keys
    auto it = script.begin();
    while (script.end() - it >= 34) {
        if (*it != 32) return {};
        ++it;
        keyspans.emplace_back(&*it, 32);
        it += 32;
        if (*it != (keyspans.size() == 1 ? OP_CHECKSIG : OP_CHECKSIGADD)) return {};
        ++it;
    }
    if (keyspans.size() == 0 || keyspans.size() > MAX_PUBKEYS_PER_MULTI_A) return {};

    // Parse threshold.
    opcodetype opcode;
    std::vector<unsigned char> data;
    if (!script.GetOp(it, opcode, data)) return {};
    if (it == script.end()) return {};
    if (*it != OP_NUMEQUAL) return {};
    ++it;
    if (it != script.end()) return {};
    auto threshold = GetScriptNumber(opcode, data, 1, (int)keyspans.size());
    if (!threshold) return {};

    // Construct result.
    return std::pair{*threshold, std::move(keyspans)};
}